

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O0

void __thiscall
miniros::ServiceCallback::ServiceCallback
          (ServiceCallback *this,ServiceCallbackHelperPtr *helper,shared_ptr<unsigned_char[]> *buf,
          size_t num_bytes,ServiceClientLinkPtr *link,bool has_tracked_object,
          VoidConstWPtr *tracked_object)

{
  byte bVar1;
  undefined4 in_ECX;
  shared_ptr<miniros::ServiceCallbackHelper> *in_RDI;
  byte in_R9B;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  CallbackInterface::CallbackInterface((CallbackInterface *)in_RDI);
  (in_RDI->super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__ServiceCallback_0061f4e0;
  std::shared_ptr<miniros::ServiceCallbackHelper>::shared_ptr
            ((shared_ptr<miniros::ServiceCallbackHelper> *)CONCAT17(bVar1,in_stack_ffffffffffffffd0)
             ,in_RDI);
  std::shared_ptr<unsigned_char[]>::shared_ptr
            ((shared_ptr<unsigned_char[]> *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
             (shared_ptr<unsigned_char[]> *)in_RDI);
  *(undefined4 *)
   &in_RDI[2].super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_ECX;
  std::shared_ptr<miniros::ServiceClientLink>::shared_ptr
            ((shared_ptr<miniros::ServiceClientLink> *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
             (shared_ptr<miniros::ServiceClientLink> *)in_RDI);
  *(byte *)&in_RDI[4].super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = bVar1 & 1;
  std::weak_ptr<const_void>::weak_ptr
            ((weak_ptr<const_void> *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
             (weak_ptr<const_void> *)in_RDI);
  return;
}

Assistant:

ServiceCallback(const ServiceCallbackHelperPtr& helper, const std::shared_ptr<uint8_t[]>& buf, size_t num_bytes,
          const ServiceClientLinkPtr& link, bool has_tracked_object, const VoidConstWPtr& tracked_object)
  : helper_(helper)
  , buffer_(buf)
  , num_bytes_(num_bytes)
  , link_(link)
  , has_tracked_object_(has_tracked_object)
  , tracked_object_(tracked_object)
  {
  }